

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O1

int ImfInputReadPixels(ImfInputFile *in,int scanLine1,int scanLine2)

{
  Imf_3_4::RgbaInputFile::readPixels((RgbaInputFile *)in,scanLine1,scanLine2);
  return 1;
}

Assistant:

int
ImfInputReadPixels (ImfInputFile* in, int scanLine1, int scanLine2)
{
    try
    {
        infile (in)->readPixels (scanLine1, scanLine2);
        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}